

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TileWire.cpp
# Opt level: O0

void __thiscall
TileWire::TileWire(TileWire *this,Board *boardPtr,Vector2u *position,bool noAdjacentUpdates,
                  Direction direction,Type type,State state1,State state2)

{
  byte in_CL;
  Vector2u *in_RDI;
  uint in_R8D;
  uint in_R9D;
  uint in_stack_00000008;
  uint in_stack_00000010;
  bool in_stack_ffffffffffffffbe;
  bool in_stack_ffffffffffffffbf;
  Board *in_stack_ffffffffffffffc8;
  Tile *in_stack_ffffffffffffffd0;
  
  Tile::Tile(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_RDI,in_stack_ffffffffffffffbf,
             in_stack_ffffffffffffffbe);
  *in_RDI = (Vector2u)&PTR__TileWire_002bc068;
  memcpy((void *)((long)&in_RDI[4].x + 1),&DAT_00263071,0x140);
  if (in_R9D == 0) {
    in_RDI[1].x = (int)in_R8D % 2;
  }
  else if ((in_R9D != 3) && (in_R9D != 4)) {
    in_RDI[1].x = in_R8D;
  }
  in_RDI[0x2c].y = in_R9D;
  in_RDI[0x2d].x = in_stack_00000008;
  if (in_R9D == 4) {
    in_RDI[0x2d].y = in_stack_00000010;
  }
  else {
    in_RDI[0x2d].y = 1;
  }
  in_RDI[0x2e].x = 0;
  in_RDI[0x2e].y = 0;
  (**(code **)((long)*in_RDI + 0x40))(in_RDI,0,in_CL & 1);
  return;
}

Assistant:

TileWire::TileWire(Board* boardPtr, const Vector2u& position, bool noAdjacentUpdates, Direction direction, Type type, State state1, State state2) : Tile(boardPtr, position, true, true) {
    if (type == STRAIGHT) {
        _direction = static_cast<Direction>(direction % 2);
    } else if (type != JUNCTION && type != CROSSOVER) {
        _direction = direction;
    }
    _type = type;
    _state1 = state1;
    if (type == CROSSOVER) {
        _state2 = state2;
    } else {
        _state2 = LOW;
    }
    _updateTimestamp1 = 0;
    _updateTimestamp2 = 0;
    addUpdate(false, noAdjacentUpdates);
}